

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O2

int wally_format_bitcoin_message
              (uchar *bytes,size_t bytes_len,uint32_t flags,uchar *bytes_out,size_t len,
              size_t *written)

{
  ulong size;
  ulong uVar1;
  uchar *bytes_00;
  uchar uVar2;
  int iVar3;
  uchar *__dest;
  uchar buf [256];
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar3 = -2;
  if ((0xffffffffffff003f < bytes_len - 0xffc1 && bytes != (uchar *)0x0) &&
     ((bytes_out != (uchar *)0x0 && written != (size_t *)0x0) && flags < 2)) {
    size = bytes_len + 0x1a + (ulong)(0xfc < bytes_len) * 2;
    uVar1 = 0x20;
    if ((flags & 1) == 0) {
      uVar1 = size;
    }
    *written = uVar1;
    iVar3 = 0;
    if (uVar1 <= len) {
      bytes_00 = bytes_out;
      if ((flags & 1) != 0) {
        if (size < 0x101) {
          bytes_00 = buf;
        }
        else {
          bytes_00 = (uchar *)wally_malloc(size);
          if (bytes_00 == (uchar *)0x0) {
            *written = 0;
            return -3;
          }
        }
      }
      builtin_memcpy(bytes_00,"\x18Bitcoin Signed Message:\n",0x19);
      if (bytes_len < 0xfd) {
        __dest = bytes_00 + 0x1a;
        uVar2 = (uchar)bytes_len;
      }
      else {
        __dest = bytes_00 + 0x1c;
        *(short *)(bytes_00 + 0x1a) = (short)bytes_len;
        uVar2 = 0xfd;
      }
      bytes_00[0x19] = uVar2;
      memcpy(__dest,bytes,bytes_len);
      if ((flags & 1) != 0) {
        wally_sha256d(bytes_00,size,bytes_out,0x20);
        wally_clear(bytes_00,size);
        if (bytes_00 != buf) {
          wally_free(bytes_00);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int wally_format_bitcoin_message(const unsigned char *bytes, size_t bytes_len,
                                 uint32_t flags,
                                 unsigned char *bytes_out, size_t len,
                                 size_t *written)
{
    unsigned char buf[256], *msg_buf = bytes_out, *out;
    const bool do_hash = (flags & BITCOIN_MESSAGE_FLAG_HASH);
    size_t msg_len;

    if (written)
        *written = 0;

    if (!bytes || !bytes_len || bytes_len > BITCOIN_MESSAGE_MAX_LEN ||
        (flags & ~MSG_ALL_FLAGS) || !bytes_out || !written)
        return WALLY_EINVAL;

    msg_len = sizeof(MSG_PREFIX) - 1 + varint_len(bytes_len) + bytes_len;
    *written = do_hash ? SHA256_LEN : msg_len;

    if (len < *written)
        return WALLY_OK; /* Not enough output space, return required size */

    if (do_hash) {
        /* Ensure we have a suitable temporary buffer to serialize into */
        msg_buf = buf;
        if (msg_len > sizeof(buf)) {
            msg_buf = wally_malloc(msg_len);
            if (!msg_buf) {
                *written = 0;
                return WALLY_ENOMEM;
            }
        }
    }

    /* Serialize the message */
    out = msg_buf;
    memcpy(out, MSG_PREFIX, sizeof(MSG_PREFIX) - 1);
    out += sizeof(MSG_PREFIX) - 1;
    if (bytes_len < 0xfd)
        *out++ = bytes_len;
    else {
        *out++ = 0xfd;
        *out++ = bytes_len & 0xff;
        *out++ = bytes_len >> 8;
    }
    memcpy(out, bytes, bytes_len);

    if (do_hash) {
        wally_sha256d(msg_buf, msg_len, bytes_out, SHA256_LEN);
        wally_clear(msg_buf, msg_len);
        if (msg_buf != buf)
            wally_free(msg_buf);
    }
    return WALLY_OK;
}